

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixturelogoutInitiatorHelper::~initiatorFixturelogoutInitiatorHelper
          (initiatorFixturelogoutInitiatorHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, logoutInitiator)
{
  object->setResponder( this );
  object->next();
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  CHECK_EQUAL( 2, object->getExpectedSenderNum() );
  CHECK_EQUAL( 2, object->getExpectedTargetNum() );

  object->next( createLogout( "ISLD", "TW", 2 ), UtcTimeStamp() );
  CHECK_EQUAL( 3, object->getExpectedSenderNum() );
  CHECK_EQUAL( 3, object->getExpectedTargetNum() );
}